

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

int ncnn::convolutiondepthwise
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,int group,
              int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  float *pfVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  pointer piVar8;
  uint uVar9;
  uint uVar10;
  int extraout_EAX;
  ulong uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  void *pvVar15;
  ulong uVar16;
  void *pvVar17;
  int iVar18;
  size_type __n;
  int iVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  vector<int,_std::allocator<int>_> _space_ofs;
  ulong local_168;
  void *local_148;
  allocator_type local_139;
  void *local_138;
  ulong local_130;
  void *local_128;
  ulong local_120;
  void *local_118;
  int local_10c;
  void *local_108;
  Mat *local_100;
  ulong local_f8;
  ulong local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  void *local_c8;
  int local_bc;
  undefined1 local_b8 [16];
  Mat *local_a0;
  undefined1 local_98 [16];
  long local_80;
  void *local_78;
  ulong local_70;
  long local_68;
  void *local_60;
  long local_58;
  void *local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_120 = (ulong)(uint)top_blob->w;
  if (bias_data->data == (void *)0x0) {
    bVar23 = true;
  }
  else {
    bVar23 = (long)bias_data->c * bias_data->cstep == 0;
  }
  local_108 = (void *)(ulong)(uint)top_blob->h;
  iVar13 = bottom_blob->w;
  iVar2 = bottom_blob->c;
  iVar3 = top_blob->c;
  uVar9 = kernel_h * kernel_w;
  __n = (size_type)(int)uVar9;
  local_100 = top_blob;
  local_a0 = bias_data;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_139);
  piVar8 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  auVar7 = local_98;
  if (0 < kernel_h) {
    iVar12 = 0;
    iVar18 = 0;
    iVar19 = 0;
    do {
      if (0 < kernel_w) {
        lVar20 = 0;
        do {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar12 + lVar20] = iVar18;
          iVar18 = iVar18 + dilation_w;
          lVar20 = lVar20 + 1;
        } while (kernel_w != (int)lVar20);
        iVar12 = iVar12 + (int)lVar20;
      }
      iVar18 = iVar18 + (iVar13 * dilation_h - dilation_w * kernel_w);
      iVar19 = iVar19 + 1;
    } while (iVar19 != kernel_h);
  }
  local_d8 = (long)(int)local_120;
  local_130 = (ulong)(uint)activation_type;
  if (iVar3 == group && iVar2 == group) {
    local_168 = local_130;
    if (0 < group) {
      local_98._4_4_ = 0;
      local_98._0_4_ = group;
      local_98._8_8_ = auVar7._8_8_;
      pvVar17 = weight_data->data;
      local_128 = bottom_blob->data;
      local_e0 = bottom_blob->cstep * bottom_blob->elemsize;
      local_138 = local_100->data;
      local_e8 = local_100->cstep * local_100->elemsize;
      local_d0 = (long)bottom_blob->w * bottom_blob->elemsize * (long)stride_h;
      local_168 = 0;
      local_130 = (ulong)(activation_type - 1);
      uVar21 = local_120;
      do {
        if (0 < (int)local_108) {
          local_c8 = (void *)(local_e0 * local_168 + (long)local_128);
          pvVar15 = (void *)(local_e8 * local_168 + (long)local_138);
          local_118 = (void *)0x0;
          uVar16 = local_130;
          do {
            pvVar6 = local_c8;
            if (0 < (int)local_d8) {
              pvVar4 = local_a0->data;
              lVar20 = (long)local_118 * local_d0;
              pfVar5 = (float *)activation_params->data;
              uVar22 = 0;
              do {
                fVar25 = 0.0;
                if (!bVar23) {
                  fVar25 = *(float *)((long)pvVar4 + local_168 * 4);
                }
                if (0 < (int)uVar9) {
                  uVar11 = 0;
                  do {
                    fVar25 = fVar25 + *(float *)((long)pvVar17 + uVar11 * 4) *
                                      *(float *)((long)pvVar6 +
                                                (long)piVar8[uVar11] * 4 +
                                                uVar22 * (long)stride_w * 4 + lVar20);
                    uVar11 = uVar11 + 1;
                  } while (uVar9 != uVar11);
                }
                fVar26 = fVar25;
                if ((uint)uVar16 < 6) {
                  switch((long)&switchD_0027535a::switchdataD_0031a0e8 +
                         (long)(int)(&switchD_0027535a::switchdataD_0031a0e8)[uVar16]) {
                  case 0x27535c:
                    if (fVar25 <= 0.0) {
                      fVar26 = 0.0;
                    }
                    break;
                  case 0x275366:
                    local_b8 = ZEXT416((uint)fVar25);
                    fVar25 = expf(fVar25);
                    fVar25 = logf(fVar25 + 1.0);
                    fVar25 = tanhf(fVar25);
                    uVar16 = local_130;
                    uVar21 = local_120;
                    fVar26 = fVar25 * (float)local_b8._0_4_;
                    break;
                  case 0x2753b6:
                    if (fVar25 <= *pfVar5) {
                      fVar25 = *pfVar5;
                    }
                    fVar26 = fVar25;
                    if (pfVar5[1] <= fVar25) {
                      fVar26 = pfVar5[1];
                    }
                    break;
                  case 0x2753c9:
                    fVar25 = expf(-fVar25);
                    uVar16 = local_130;
                    uVar21 = local_120;
                    fVar26 = 1.0 / (fVar25 + 1.0);
                    break;
                  case 0x27540d:
                    fVar26 = (float)(~-(uint)(0.0 < fVar25) & (uint)*pfVar5 |
                                    -(uint)(0.0 < fVar25) & 0x3f800000) * fVar25;
                    break;
                  case 0x275434:
                    fVar1 = *pfVar5;
                    fVar24 = -pfVar5[1] / fVar1;
                    fVar26 = 0.0;
                    if ((fVar24 <= fVar25) && (fVar26 = fVar25, fVar25 <= fVar24 + 1.0 / fVar1)) {
                      fVar26 = (fVar1 * fVar25 + pfVar5[1]) * fVar25;
                    }
                  }
                }
                *(float *)((long)pvVar15 + uVar22 * 4) = fVar26;
                uVar22 = uVar22 + 1;
              } while (uVar22 != uVar21);
            }
            pvVar15 = (void *)((long)pvVar15 + local_d8 * 4);
            local_118 = (void *)((long)local_118 + 1);
          } while (local_118 != local_108);
        }
        local_168 = local_168 + 1;
        pvVar17 = (void *)((long)pvVar17 + __n * 4);
      } while (local_168 != local_98._0_8_);
    }
  }
  else {
    uVar10 = iVar2 / group;
    uVar21 = (long)iVar3 / (long)group;
    local_168 = uVar21 & 0xffffffff;
    local_10c = (int)uVar21;
    if (0 < group) {
      local_78 = weight_data->data;
      local_118 = (void *)(long)stride_w;
      local_e0 = (long)stride_h;
      local_80 = (long)local_10c;
      local_70 = (ulong)(uint)group;
      local_50 = (void *)(uVar21 & 0xffffffff);
      local_bc = uVar10 * local_10c * uVar9;
      local_e8 = (long)(int)(uVar10 * uVar9) << 2;
      local_f0 = 0;
      local_f8 = 0;
      uVar21 = local_120;
      do {
        if (0 < local_10c) {
          local_b8._0_8_ = (void *)((long)local_78 + (long)(int)local_f0 * 4);
          local_58 = local_f8 * local_80;
          local_60 = local_100->data;
          iVar13 = (int)local_f8;
          local_68 = local_100->cstep * local_100->elemsize;
          local_138 = (void *)0x0;
          do {
            if (0 < (int)local_108) {
              local_d0 = (long)local_138 + local_58;
              local_148 = (void *)(local_68 * local_d0 + (long)local_60);
              local_128 = (void *)0x0;
              do {
                if (0 < (int)uVar21) {
                  local_c8 = local_a0->data;
                  iVar2 = bottom_blob->w;
                  lVar20 = (long)local_128 * local_e0;
                  pfVar5 = (float *)activation_params->data;
                  uVar16 = 0;
                  do {
                    fVar25 = 0.0;
                    if (!bVar23) {
                      fVar25 = *(float *)((long)local_c8 + local_d0 * 4);
                    }
                    if (0 < (int)uVar10) {
                      uVar22 = 0;
                      lVar14 = local_b8._0_8_;
                      do {
                        if (0 < (int)uVar9) {
                          uVar11 = 0;
                          do {
                            fVar25 = fVar25 + *(float *)(lVar14 + uVar11 * 4) *
                                              *(float *)((long)bottom_blob->data +
                                                        (long)piVar8[uVar11] * 4 +
                                                        (uVar22 + uVar10 * iVar13) *
                                                        bottom_blob->cstep * bottom_blob->elemsize +
                                                        uVar16 * (long)local_118 * 4 +
                                                        bottom_blob->elemsize * lVar20 * iVar2);
                            uVar11 = uVar11 + 1;
                          } while (uVar9 != uVar11);
                        }
                        uVar22 = uVar22 + 1;
                        lVar14 = lVar14 + __n * 4;
                      } while (uVar22 != uVar10);
                    }
                    fVar26 = fVar25;
                    switch(activation_type) {
                    case 1:
                      if (fVar25 <= 0.0) {
                        fVar26 = 0.0;
                      }
                      break;
                    case 2:
                      fVar26 = (float)(~-(uint)(0.0 < fVar25) & (uint)*pfVar5 |
                                      -(uint)(0.0 < fVar25) & 0x3f800000) * fVar25;
                      break;
                    case 3:
                      if (fVar25 <= *pfVar5) {
                        fVar25 = *pfVar5;
                      }
                      fVar26 = fVar25;
                      if (pfVar5[1] <= fVar25) {
                        fVar26 = pfVar5[1];
                      }
                      break;
                    case 4:
                      fVar25 = expf(-fVar25);
                      uVar21 = local_120;
                      fVar26 = 1.0 / (fVar25 + 1.0);
                      break;
                    case 5:
                      local_98 = ZEXT416((uint)fVar25);
                      fVar25 = expf(fVar25);
                      fVar25 = logf(fVar25 + 1.0);
                      fVar25 = tanhf(fVar25);
                      uVar21 = local_120;
                      fVar26 = fVar25 * (float)local_98._0_4_;
                      break;
                    case 6:
                      fVar1 = *pfVar5;
                      fVar24 = -pfVar5[1] / fVar1;
                      fVar26 = 0.0;
                      if ((fVar24 <= fVar25) && (fVar26 = fVar25, fVar25 <= fVar24 + 1.0 / fVar1)) {
                        fVar26 = (fVar1 * fVar25 + pfVar5[1]) * fVar25;
                      }
                    }
                    *(float *)((long)local_148 + uVar16 * 4) = fVar26;
                    uVar16 = uVar16 + 1;
                  } while (uVar16 != uVar21);
                }
                local_148 = (void *)((long)local_148 + local_d8 * 4);
                local_128 = (void *)((long)local_128 + 1);
              } while (local_128 != local_108);
            }
            local_138 = (void *)((long)local_138 + 1);
            local_b8._0_8_ = local_b8._0_8_ + local_e8;
          } while (local_138 != local_50);
        }
        local_f8 = local_f8 + 1;
        local_168 = (ulong)(uint)((int)local_f0 + local_bc);
        local_f0 = local_168;
      } while (local_f8 != local_70);
    }
  }
  iVar13 = (int)local_168;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar13 = extraout_EAX;
  }
  return iVar13;
}

Assistant:

static int convolutiondepthwise(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int bias_term = bias_data.empty() ? 0 : 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (inch == group && group == outch)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }

                outptr += outw;
            }
        }
    }
    else
    {
        // group convolution
        const int inch_g = inch / group;
        const int outch_g = outch / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outch_g; p++)
            {
                float* outptr = top_blob.channel(g * outch_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * inch_g * outch_g * g;

#if NCNN_SIMPLEOMP
                // shadowed variable for less openmp task args
                const int outw = top_blob.w;
                const int outh = top_blob.h;
#endif

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[outch_g * g + p];

                        const float* kptr = weight_data_ptr + maxk * inch_g * p;

                        for (int q = 0; q < inch_g; q++)
                        {
                            const Mat m = bottom_blob.channel(inch_g * g + q);
                            const float* sptr = m.row(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                float val = sptr[space_ofs[k]];
                                float w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        outptr[j] = activation_ss(sum, activation_type, activation_params);
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}